

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMinLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ActivationLinear *pAVar2;
  bool bVar3;
  LayerUnion LVar4;
  LogMessage *other;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  Result r;
  string err;
  size_type *local_d0;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result((Result *)&local_d0);
  validateInputCount((Result *)local_a8,layer,1,1);
  local_d0 = (size_type *)local_a8;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a0);
  bVar3 = Result::good((Result *)&local_d0);
  if (local_a0._M_p != local_98 + 8) {
    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
  }
  if (bVar3) {
    validateOutputCount((Result *)local_a8,layer,1,1);
    local_d0 = (size_type *)local_a8;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a0);
    bVar3 = Result::good((Result *)&local_d0);
    if (local_a0._M_p != local_98 + 8) {
      operator_delete(local_a0._M_p,local_98._8_8_ + 1);
    }
    if (bVar3) {
      if (layer->_oneof_case_[0] == 0x3fc) {
        LVar4 = layer->layer_;
      }
      else {
        LVar4.argmin_ = Specification::ArgMinLayerParams::default_instance();
      }
      if ((LVar4.argmin_)->removedim_ == false) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ArgMin","");
        validateInputOutputRankEquality((Result *)local_a8,layer,&local_50,&this->blobNameToRank);
        local_d0 = (size_type *)local_a8;
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a0);
        bVar3 = Result::good((Result *)&local_d0);
        if (local_a0._M_p != local_98 + 8) {
          operator_delete(local_a0._M_p,local_98._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) goto LAB_00544a8d;
      }
      if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
        if (layer->_oneof_case_[0] == 0x3fc) {
          LVar4 = layer->layer_;
        }
        else {
          LVar4.argmin_ = Specification::ArgMinLayerParams::default_instance();
          if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            other = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_a8,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
          }
        }
        lVar5 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                     elements[0] + 0x24);
        pAVar2 = ((LVar4.activation_)->NonlinearityType_).linear_;
        if ((SBORROW8((long)pAVar2,-lVar5) !=
             (long)&(pAVar2->super_MessageLite)._vptr_MessageLite + lVar5 < 0) ||
           (lVar5 <= (long)pAVar2)) {
          std::operator+(&local_70,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                         (layer->name_).ptr_);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
          psVar7 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar7) {
            local_98._0_8_ = *psVar7;
            local_98._8_8_ = plVar6[3];
            local_a8 = (undefined1  [8])local_98;
          }
          else {
            local_98._0_8_ = *psVar7;
            local_a8 = (undefined1  [8])*plVar6;
          }
          local_a0._M_p = (pointer)plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
          if (local_a8 != (undefined1  [8])local_98) {
            operator_delete((void *)local_a8,local_98._0_8_ + 1);
          }
          goto LAB_00544adb;
        }
      }
      Result::Result(__return_storage_ptr__);
      goto LAB_00544adb;
    }
  }
LAB_00544a8d:
  *(size_type **)__return_storage_ptr__ = local_d0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p == &local_b8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_b8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_c8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_c0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_c8._M_p = (pointer)&local_b8;
LAB_00544adb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMinLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!layer.argmin().removedim()) {
        if (!(r = validateInputOutputRankEquality(layer, "ArgMin", blobNameToRank)).good()) return r;
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmin();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}